

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall
StatisticsWriter::writeHistograms
          (StatisticsWriter *this,ostream *stream,MultivariateTracker *tracker)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  long lVar3;
  ostream *poVar4;
  undefined1 local_118 [8];
  DynamicHistogram<double> histogram;
  string name;
  long i;
  allocator<char> local_49;
  string local_48 [8];
  string header;
  int totalWidth;
  int numDim;
  MultivariateTracker *tracker_local;
  ostream *stream_local;
  StatisticsWriter *this_local;
  
  lVar3 = MultivariateTracker::getDimension(tracker);
  header.field_2._12_4_ = (undefined4)lVar3;
  if (header.field_2._12_4_ == 0) {
    header.field_2._8_4_ = 0x14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_48,0x14,'=',&local_49);
    std::allocator<char>::~allocator(&local_49);
    poVar4 = std::operator<<((ostream *)stream,(string *)this);
    poVar4 = std::operator<<(poVar4,local_48);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)stream,(string *)this);
    _Var1 = std::setfill<char>(' ');
    poVar4 = std::operator<<(poVar4,_Var1._M_c);
    _Var2 = std::setw((int)header.field_2._8_4_ / 2);
    poVar4 = std::operator<<(poVar4,_Var2);
    poVar4 = std::operator<<(poVar4,"Histograms");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)stream,(string *)this);
    poVar4 = std::operator<<(poVar4,local_48);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)stream,(string *)this);
    poVar4 = std::operator<<(poVar4,"No valid data");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_48);
  }
  else {
    for (name.field_2._8_8_ = 0; (long)name.field_2._8_8_ < (long)(int)header.field_2._12_4_;
        name.field_2._8_8_ = name.field_2._8_8_ + 1) {
      MultivariateTracker::getName_abi_cxx11_
                ((string *)
                 &histogram._temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,tracker,name.field_2._8_8_);
      MultivariateTracker::getHistogram
                ((DynamicHistogram<double> *)local_118,tracker,name.field_2._8_8_);
      writeHistogram<double>
                (this,stream,
                 (string *)
                 &histogram._temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(DynamicHistogram<double> *)local_118);
      DynamicHistogram<double>::~DynamicHistogram((DynamicHistogram<double> *)local_118);
      std::__cxx11::string::~string
                ((string *)
                 &histogram._temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  return;
}

Assistant:

void
    writeHistograms(std::ostream & stream,
                    MultivariateTracker & tracker)
    {
        
        int numDim = tracker.getDimension();

        // Print no data header
        if (numDim == 0)
        {
            int totalWidth = 20;
            std::string header(totalWidth,'='); 
            stream << this->_comment << header << std::endl;
            stream << this->_comment << std::setfill (' ') << std::setw (totalWidth/2) << "Histograms" << std::endl;
            stream << this->_comment << header << std::endl;
            stream << this->_comment << "No valid data" << std::endl;
            return;
        }

        for (long i = 0; i < numDim; i++)
        {
            const std::string name = tracker.getName(i);
            DynamicHistogram<double> histogram = tracker.getHistogram(i);
            this->writeHistogram<double>(stream, name, histogram);
        }

        return;
    }